

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# burstsort_mkq.cpp
# Opt level: O0

TSTNode<unsigned_char> * __thiscall
BurstSimple<unsigned_char>::operator()
          (BurstSimple<unsigned_char> *this,
          vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket,uchar *oracle,
          size_t param_3)

{
  byte bVar1;
  TSTNode<unsigned_char> *this_00;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_01;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_02;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *this_03;
  size_type sVar2;
  const_reference ppuVar3;
  reference ppvVar4;
  ostream *poVar5;
  uint local_60;
  uint i;
  uchar pivot;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket2;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket1;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket0;
  TSTNode<unsigned_char> *new_node;
  size_t param_3_local;
  uchar *oracle_local;
  vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *bucket_local;
  BurstSimple<unsigned_char> *this_local;
  
  this_00 = (TSTNode<unsigned_char> *)operator_new(0x28);
  TSTNode<unsigned_char>::TSTNode(this_00);
  this_01 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector(this_01);
  this_02 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector(this_02);
  this_03 = (vector<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)operator_new(0x18);
  std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::vector(this_03);
  sVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket);
  bVar1 = pseudo_median<unsigned_char>(oracle,oracle + sVar2);
  for (local_60 = 0;
      sVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(bucket),
      local_60 < sVar2; local_60 = local_60 + 1) {
    if (oracle[local_60] < bVar1) {
      ppuVar3 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          (bucket,(ulong)local_60);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(this_01,ppuVar3);
    }
    else if (oracle[local_60] == bVar1) {
      ppuVar3 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          (bucket,(ulong)local_60);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(this_02,ppuVar3);
    }
    else {
      ppuVar3 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::operator[]
                          (bucket,(ulong)local_60);
      std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::push_back(this_03,ppuVar3);
    }
  }
  this_00->pivot = bVar1;
  ppvVar4 = std::array<void_*,_3UL>::operator[]((array<void_*,_3UL> *)this_00,0);
  *ppvVar4 = this_01;
  ppvVar4 = std::array<void_*,_3UL>::operator[]((array<void_*,_3UL> *)this_00,1);
  *ppvVar4 = this_02;
  ppvVar4 = std::array<void_*,_3UL>::operator[]((array<void_*,_3UL> *)this_00,2);
  *ppvVar4 = this_03;
  poVar5 = std::operator<<((ostream *)&std::cerr,(string *)__debug_indent_str_abi_cxx11_);
  poVar5 = std::operator<<(poVar5,"BurstSimple() pivot=");
  poVar5 = std::operator<<(poVar5,bVar1);
  poVar5 = std::operator<<(poVar5," [0]=");
  sVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(this_01);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar2);
  poVar5 = std::operator<<(poVar5," [1]=");
  sVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(this_02);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar2);
  poVar5 = std::operator<<(poVar5," [2]=");
  sVar2 = std::vector<unsigned_char_*,_std::allocator<unsigned_char_*>_>::size(this_03);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar2);
  std::operator<<(poVar5,"\n");
  return this_00;
}

Assistant:

TSTNode<CharT>*
	operator()(const BucketT& bucket, CharT* oracle, size_t /*depth*/) const
	{
		TSTNode<CharT>* new_node = new TSTNode<CharT>;
		BucketT* bucket0 = new BucketT;
		BucketT* bucket1 = new BucketT;
		BucketT* bucket2 = new BucketT;
		CharT pivot = pseudo_median(oracle, oracle+bucket.size());
		for (unsigned i=0; i < bucket.size(); ++i) {
			if (oracle[i] < pivot) {
				bucket0->push_back(bucket[i]);
			} else if (oracle[i] == pivot) {
				bucket1->push_back(bucket[i]);
			} else {
				bucket2->push_back(bucket[i]);
			}
		}
		new_node->pivot = pivot;
		new_node->buckets[0] = bucket0;
		new_node->buckets[1] = bucket1;
		new_node->buckets[2] = bucket2;
		debug() << "BurstSimple() pivot=" << pivot
			<< " [0]=" << bucket0->size()
			<< " [1]=" << bucket1->size()
			<< " [2]=" << bucket2->size()
			<< "\n";
		return new_node;
	}